

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall Api::initFromFile(Api *this,string *string)

{
  int iVar1;
  AEntity *pAVar2;
  Weapon *pWVar3;
  Minion *pMVar4;
  int local_30;
  int i_1;
  int local_1c;
  int i;
  string *string_local;
  Api *this_local;
  
  for (local_1c = 0; local_1c < 0x1e; local_1c = local_1c + 1) {
    iVar1 = rand();
    if (iVar1 % 2 == 0) {
      pAVar2 = (AEntity *)operator_new(0x30);
      pMVar4 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar4,&this->_event);
      AEntity::AEntity(pAVar2,pMVar4);
      addCardToPlayer(this,0,pAVar2);
    }
    else {
      pAVar2 = (AEntity *)operator_new(0x30);
      pWVar3 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar3,&this->_event);
      AEntity::AEntity(pAVar2,pWVar3);
      addCardToPlayer(this,0,pAVar2);
    }
  }
  for (local_30 = 0; local_30 < 0x1e; local_30 = local_30 + 1) {
    iVar1 = rand();
    if (iVar1 % 2 == 0) {
      pAVar2 = (AEntity *)operator_new(0x30);
      pMVar4 = (Minion *)operator_new(0xb0);
      Minion1::Minion1((Minion1 *)pMVar4,&this->_event);
      AEntity::AEntity(pAVar2,pMVar4);
      addCardToPlayer(this,1,pAVar2);
    }
    else {
      pAVar2 = (AEntity *)operator_new(0x30);
      pWVar3 = (Weapon *)operator_new(0xa0);
      Weapon1::Weapon1((Weapon1 *)pWVar3,&this->_event);
      AEntity::AEntity(pAVar2,pWVar3);
      addCardToPlayer(this,1,pAVar2);
    }
  }
  return;
}

Assistant:

void Api::initFromFile(std::string string) {
    // TODO: generate players deck from file
    // tmp generation deck from exemple class weapon1 and minion1
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(0, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(0, new AEntity(new Minion1(_event)));
        }
    }
    for (int i = 0; i < 30; ++i) {
        if (rand() % 2) {
            this->addCardToPlayer(1, new AEntity(new Weapon1(_event)));
        } else {
            this->addCardToPlayer(1, new AEntity(new Minion1(_event)));
        }
    }
}